

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

string * jsonnet::internal::unparse_id_abi_cxx11_(Identifier *id)

{
  string *in_RDI;
  
  encode_utf8(&id->name);
  return in_RDI;
}

Assistant:

static std::string unparse_id(const Identifier *id)
{
    return encode_utf8(id->name);
}